

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

bool __thiscall
dxil_spv::CFGStructurizer::block_is_breaking_phi_construct(CFGStructurizer *this,CFGNode *node)

{
  CFGNode *pCVar1;
  bool bVar2;
  size_type sVar3;
  CFGNode *pCVar4;
  reference ppCVar5;
  CFGNode *pdf;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  Vector<CFGNode_*> *__range3_1;
  CFGNode *df;
  const_iterator __end3;
  const_iterator __begin3;
  Vector<CFGNode_*> *__range3;
  CFGNode *header_pdom;
  bool merge_is_outside_loop;
  CFGNode *loop_header;
  CFGNode *pred;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  Vector<CFGNode_*> *__range1_1;
  CFGNode *succ;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<CFGNode_*> *__range1;
  CFGNode *node_local;
  CFGStructurizer *this_local;
  
  bVar2 = std::vector<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
          ::empty(&(node->ir).operations);
  if (bVar2) {
    sVar3 = std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
            size(&node->pred);
    if (sVar3 < 2) {
      this_local._7_1_ = false;
    }
    else {
      bVar2 = CFGNode::post_dominates_perfect_structured_construct(node);
      if (bVar2) {
        this_local._7_1_ = false;
      }
      else if ((node->succ_back_edge == (CFGNode *)0x0) && (node->pred_back_edge == (CFGNode *)0x0))
      {
        sVar3 = std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                size(&node->succ);
        if (sVar3 == 1) {
          if ((node->ir).terminator.type != Branch) {
            return false;
          }
        }
        else {
          sVar3 = std::
                  vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ::size(&node->succ);
          if (sVar3 != 2) {
            return false;
          }
          if ((node->ir).terminator.type != Condition) {
            return false;
          }
        }
        __end1 = std::
                 vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                 begin(&node->succ);
        succ = (CFGNode *)
               std::
               vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
               end(&node->succ);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end1,(__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                           *)&succ), bVar2) {
          ppCVar5 = __gnu_cxx::
                    __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                    ::operator*(&__end1);
          pCVar4 = *ppCVar5;
          bVar2 = CFGNode::dominates(node,pCVar4);
          if (bVar2) {
            return false;
          }
          bVar2 = ladder_chain_has_phi_dependencies(pCVar4,node);
          if (!bVar2) {
            return false;
          }
          __gnu_cxx::
          __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
          ::operator++(&__end1);
        }
        __end1_1 = std::
                   vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ::begin(&node->pred);
        pred = (CFGNode *)
               std::
               vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
               end(&node->pred);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end1_1,
                                  (__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                   *)&pred), bVar2) {
          ppCVar5 = __gnu_cxx::
                    __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                    ::operator*(&__end1_1);
          if ((*ppCVar5)->succ_back_edge != (CFGNode *)0x0) {
            return false;
          }
          __gnu_cxx::
          __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
          ::operator++(&__end1_1);
        }
        pCVar4 = get_innermost_loop_header_for(this,node);
        if ((((pCVar4 != (CFGNode *)0x0) && (pCVar4->pred_back_edge != (CFGNode *)0x0)) &&
            (bVar2 = CFGNode::dominates(pCVar4,node), bVar2)) &&
           ((bVar2 = std::
                     vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ::empty(&pCVar4->pred_back_edge->succ), bVar2 &&
            (bVar2 = query_reachability(this,node,pCVar4->pred_back_edge),
            ((bVar2 ^ 0xffU) & 1) != 0)))) {
          pCVar1 = pCVar4->pred_back_edge->immediate_post_dominator;
          __end3 = std::
                   vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ::begin(&node->dominance_frontier);
          df = (CFGNode *)
               std::
               vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
               end(&node->dominance_frontier);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                             *)&df), bVar2) {
            ppCVar5 = __gnu_cxx::
                      __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                      ::operator*(&__end3);
            if (*ppCVar5 == pCVar1) {
              return true;
            }
            __gnu_cxx::
            __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
            ::operator++(&__end3);
          }
          __end3_1 = std::
                     vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ::begin(&node->post_dominance_frontier);
          pdf = (CFGNode *)
                std::
                vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                end(&node->post_dominance_frontier);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end3_1,
                                    (__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                     *)&pdf), bVar2) {
            ppCVar5 = __gnu_cxx::
                      __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                      ::operator*(&__end3_1);
            bVar2 = query_reachability(this,*ppCVar5,pCVar4->pred_back_edge);
            if (bVar2) {
              return false;
            }
            __gnu_cxx::
            __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
            ::operator++(&__end3_1);
          }
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CFGStructurizer::block_is_breaking_phi_construct(const CFGNode *node) const
{
	// Only bother with blocks which don't do anything useful work.
	// The only opcodes they should have are PHI nodes and a (conditional) branch.
	if (!node->ir.operations.empty())
		return false;
	if (node->pred.size() <= 1)
		return false;

	// Don't bother with anything that could be considered load bearing.
	if (node->post_dominates_perfect_structured_construct())
		return false;

	// Anything related to loop/continue blocks, we don't bother with.
	if (node->succ_back_edge || node->pred_back_edge)
		return false;

	if (node->succ.size() == 1)
	{
		if (node->ir.terminator.type != Terminator::Type::Branch)
			return false;
	}
	else if (node->succ.size() == 2)
	{
		if (node->ir.terminator.type != Terminator::Type::Condition)
			return false;
	}
	else
		return false;

	for (auto *succ : node->succ)
	{
		if (node->dominates(succ))
			return false;

		// Checks if either the merge block or successor is sensitive to PHI somehow.
		if (!ladder_chain_has_phi_dependencies(succ, node))
			return false;
	}

	// This is a merge block candidate for a loop, don't split.
	// It will only confuse things where we'll need to re-merge the split blocks anyways.
	for (auto *pred : node->pred)
		if (pred->succ_back_edge)
			return false;

	// A more complicated case where we want the block to remain as a ladder block.
	auto *loop_header = get_innermost_loop_header_for(node);
	if (loop_header && loop_header->pred_back_edge &&
	    loop_header->dominates(node) && loop_header->pred_back_edge->succ.empty())
	{
		bool merge_is_outside_loop = !query_reachability(*node, *loop_header->pred_back_edge);
		if (merge_is_outside_loop)
		{
			auto *header_pdom = loop_header->pred_back_edge->immediate_post_dominator;

			// We only want to avoid the split when this is a meaningful ladder.
			// If the paths all end up in the same merge anyway, it's safer to split.
			for (auto *df : node->dominance_frontier)
				if (df == header_pdom)
					return true;

			for (auto *pdf : node->post_dominance_frontier)
			{
				// We can't reach, but the PDF can. We're confident we're a loop exit.
				if (query_reachability(*pdf, *loop_header->pred_back_edge))
					return false;
			}
		}
	}

	return true;
}